

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::
BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
::ExpressionIterator::ExpressionIterator
          (ExpressionIterator *this,
          BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
          *expression)

{
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  *expression_local;
  ExpressionIterator *this_local;
  
  ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>::ExpressionIterator
  ::ExpressionIterator
            (&this->iterator1_,
             (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
             expression->e1_);
  ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>::ExpressionIterator
  ::ExpressionIterator
            (&this->iterator2_,
             (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
             expression->e2_);
  return;
}

Assistant:

ExpressionIterator(const BinaryViewExpression<E1, T1, E2, T2, BinaryFunctor>& expression)
        : binaryFunctor_(expression.binaryFunctor_),
          iterator1_(expression.e1_), 
          iterator2_(expression.e2_)
            {}